

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

int __thiscall DetectorSS::Estimate(DetectorSS *this,int bucket,uchar *bmp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *piVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int i;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined8 in_XMM2_Qb;
  ulong local_50;
  undefined1 extraout_var [56];
  
  uVar4 = (ulong)(this->ss_).c;
  iVar6 = bucket * (this->ss_).offsets[uVar4];
  iVar11 = 1;
  uVar10 = 0xffffffffffffffff;
  uVar8 = 0;
  while( true ) {
    iVar9 = (int)uVar10;
    if ((long)((int)uVar4 + -1) <= (long)uVar8) break;
    iVar7 = (this->ss_).offsets[uVar8] + iVar6;
    iVar7 = countzerobits(bmp,iVar7,(this->ss_).b + iVar7);
    if ((this->ss_).b - iVar7 <= (this->ss_).setmax) break;
    iVar11 = iVar11 * 2;
    uVar8 = uVar8 + 1;
    uVar4 = (ulong)(uint)(this->ss_).c;
    uVar10 = (ulong)(iVar9 + 1);
  }
  local_50 = 0;
  while( true ) {
    lVar5 = (long)(this->ss_).c;
    piVar3 = (this->ss_).offsets;
    if (lVar5 + -1 <= (long)uVar8) break;
    iVar7 = piVar3[uVar8] + iVar6;
    iVar7 = countzerobits(bmp,iVar7,(this->ss_).b + iVar7);
    dVar12 = (double)(this->ss_).b;
    dVar13 = log(dVar12);
    dVar14 = log((double)iVar7);
    if ((iVar7 == 0) || ((this->ss_).setmax < (this->ss_).b - iVar7)) {
      local_50 = 0;
      uVar10 = uVar8 & 0xffffffff;
    }
    else {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_50;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dVar12;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar13 - dVar14;
      auVar16 = vfmadd231sd_fma(auVar20,auVar15,auVar1);
      local_50 = auVar16._0_8_;
    }
    uVar8 = uVar8 + 1;
  }
  iVar6 = iVar6 + piVar3[lVar5 + -1];
  iVar6 = countzerobits(bmp,iVar6,(this->ss_).lastb + iVar6);
  auVar17._0_8_ = (double)(this->ss_).lastb;
  auVar19._0_8_ = log(auVar17._0_8_);
  auVar19._8_56_ = extraout_var;
  auVar16 = auVar19._0_16_;
  if (iVar6 != 0) {
    dVar12 = log((double)iVar6);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar19._0_8_ - dVar12;
  }
  auVar17._8_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_50;
  auVar16 = vfmadd213sd_fma(auVar16,auVar17,auVar2);
  auVar18._0_8_ = (double)(iVar11 << ((int)uVar10 - iVar9 & 0x1fU));
  auVar18._8_8_ = in_XMM2_Qb;
  auVar16 = vfmadd213sd_fma(auVar18,auVar16,ZEXT816(0x3fe0000000000000));
  return (int)auVar16._0_8_;
}

Assistant:

int DetectorSS::Estimate(int bucket, unsigned char* bmp) {
	int offs = bucket * ss_.offsets[ss_.c];
	int z, tmpoff = 0, base;
	double m;
	int factor = 1;
	for (base = 0; base < ss_.c - 1; base++) {
		tmpoff = offs + ss_.offsets[base];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		//TL: if the bitmap is not full
		if (ss_.b - z <= ss_.setmax) {
			break;
		}
		else {
			factor = factor * 2;
		}
	}
	m = 0;

	int pos = base - 1;
	for (int i = base; i < ss_.c - 1; i++) {
		tmpoff = offs + ss_.offsets[i];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		m += ss_.b * (log(ss_.b) - log(z));
		if (z == 0 || ss_.b - z > ss_.setmax) {
			pos = i;
			m = 0;
		}
	}
	factor = factor * (1 << (pos - base + 1));

	tmpoff = offs + ss_.offsets[ss_.c - 1];
	z = countzerobits(bmp, tmpoff, tmpoff + ss_.lastb);
	if (z == 0) {
		m += ss_.lastb * (log(ss_.lastb));
	}
	else {
		m += ss_.lastb * (log(ss_.lastb) - log(z));
	}
	return (int)(factor * m + 0.5);
}